

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::pointer> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::pointer>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::pointer_const&>
          (allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>
           *this,pointer *args)

{
  long lVar1;
  __int_type_conflict _Var2;
  holder<cs::pointer> *phVar3;
  new_allocator<cs_impl::any::holder<cs::pointer>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::pointer>_> *in_RDI;
  holder<cs::pointer> *ptr;
  holder<cs::pointer> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::pointer> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_00163c82;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::pointer>_>::allocate(in_RSI,__n,in_RDI)
  ;
LAB_00163c82:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::pointer>>::
  construct<cs_impl::any::holder<cs::pointer>,cs::pointer_const&>
            (in_RDI,in_stack_ffffffffffffffd8,(pointer *)0x163c9d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}